

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  BinaryType BVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  element_type *peVar4;
  __int128 result;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  __int128 rightValue;
  __int128 leftValue;
  undefined1 local_79;
  undefined1 local_78 [16];
  shared_ptr<const_calc4::Operator> local_68;
  shared_ptr<const_calc4::Operator> local_58;
  long local_48;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  peVar2 = (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->left).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Operator)(peVar2,this);
  local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->right).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Operator)(peVar2,this);
  local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar3 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<__int128> *)
                     local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(shared_ptr<const_calc4::Operator> *)
                            local_58.
                            super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(__int128 *)&local_38);
  if (bVar3) {
    bVar3 = TryGetPrecomputedValue
                      ((PrecomputeVisitor<__int128> *)
                       local_68.
                       super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (shared_ptr<const_calc4::Operator> *)
                       local_68.
                       super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(__int128 *)&local_48);
    peVar4 = (op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (bVar3) {
      BVar1 = peVar4->type;
      if (BVar1 == Div) {
        if (local_48 != 0 || local_40 != 0) {
          local_78 = __divti3(local_38,local_30);
          std::
          __shared_ptr<calc4::PrecomputedOperator::AllocateHelper<calc4::PrecomputedOperator>::Object,(__gnu_cxx::_Lock_policy)2>
          ::
          __shared_ptr<std::allocator<calc4::PrecomputedOperator::AllocateHelper<calc4::PrecomputedOperator>::Object>,__int128_const&>
                    ((__shared_ptr<calc4::PrecomputedOperator::AllocateHelper<calc4::PrecomputedOperator>::Object,(__gnu_cxx::_Lock_policy)2>
                      *)&local_28,
                     (allocator<calc4::PrecomputedOperator::AllocateHelper<calc4::PrecomputedOperator>::Object>
                      *)&local_79,(__int128 *)local_78);
          goto LAB_00121740;
        }
      }
      else if (BVar1 != Mod || (local_48 != 0 || local_40 != 0)) {
        (*(code *)(&DAT_00137ff0 + *(int *)(&DAT_00137ff0 + (ulong)BVar1 * 4)))(local_38,local_30);
        return;
      }
    }
  }
  else {
    peVar4 = (op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  local_78._0_4_ = peVar4->type;
  std::
  __shared_ptr<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object>,std::shared_ptr<calc4::Operator_const>const&,std::shared_ptr<calc4::Operator_const>const&,calc4::BinaryType&>
            ((__shared_ptr<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object,(__gnu_cxx::_Lock_policy)2>
              *)&local_28,
             (allocator<calc4::BinaryOperator::AllocateHelper<calc4::BinaryOperator>::Object> *)
             &local_79,&local_58,&local_68,(BinaryType *)local_78);
LAB_00121740:
  this_00 = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_20;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }